

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O3

void __thiscall BindRnase::Execute(BindRnase *this)

{
  int iVar1;
  int iVar2;
  SpeciesTracker *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar3;
  shared_ptr<Rnase> new_pol;
  Ptr polymer;
  undefined1 local_49;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [32];
  
  Bind::ChoosePolymer((Bind *)local_28);
  std::__shared_ptr<Rnase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<Rnase>,Rnase_const&>
            ((__shared_ptr<Rnase,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<Rnase> *)&local_49,&this->pol_template_);
  local_48 = local_38;
  local_40 = local_30;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  (**(code **)(*(_func_int **)local_28._0_8_ + 8))
            (local_28._0_8_,&local_48,&(this->super_Bind).promoter_name_);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  this_00 = SpeciesTracker::Instance();
  local_28._24_8_ = *(_func_int **)(local_28._0_8_ + 0x58);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_28._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    iVar2 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_)->_M_use_count;
    local_28._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if (iVar2 == 0) {
        local_28._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_0012b73e;
      }
      LOCK();
      iVar1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_)->_M_use_count;
      bVar3 = iVar2 == iVar1;
      if (bVar3) {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_)->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar3);
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_)->_M_use_count != 0) {
      local_28._16_8_ = *(_func_int **)(local_28._0_8_ + 0x50);
      goto LAB_0012b73e;
    }
  }
  local_28._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0012b73e:
  Signal<std::shared_ptr<Reaction>_>::Emit
            (&this_00->propensity_signal_,(shared_ptr<Reaction> *)(local_28 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if ((element_type *)local_28._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_);
  }
  return;
}

Assistant:

void BindRnase::Execute() {
  auto polymer = ChoosePolymer();
  auto new_pol = std::make_shared<Rnase>(pol_template_);
  polymer->Bind(new_pol, promoter_name_);
  SpeciesTracker::Instance().propensity_signal_.Emit(polymer->wrapper());
}